

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxedit.c
# Opt level: O0

WebPMux * WebPNewInternal(int version)

{
  int in_EDI;
  WebPMux *mux;
  undefined4 in_stack_fffffffffffffff0;
  uint64_t in_stack_fffffffffffffff8;
  WebPMux *pWVar1;
  
  if (in_EDI >> 8 == 1) {
    pWVar1 = (WebPMux *)
             WebPSafeMalloc(in_stack_fffffffffffffff8,CONCAT44(in_EDI,in_stack_fffffffffffffff0));
    if (pWVar1 != (WebPMux *)0x0) {
      MuxInit((WebPMux *)0x1a3bc2);
    }
  }
  else {
    pWVar1 = (WebPMux *)0x0;
  }
  return pWVar1;
}

Assistant:

WebPMux* WebPNewInternal(int version) {
  if (WEBP_ABI_IS_INCOMPATIBLE(version, WEBP_MUX_ABI_VERSION)) {
    return NULL;
  } else {
    WebPMux* const mux = (WebPMux*)WebPSafeMalloc(1ULL, sizeof(WebPMux));
    if (mux != NULL) MuxInit(mux);
    return mux;
  }
}